

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprog.c
# Opt level: O2

void greet_prog_knight(CHAR_DATA *mob,CHAR_DATA *ch)

{
  bool bVar1;
  
  bVar1 = is_npc(ch);
  if (bVar1) {
    return;
  }
  if (0 < ch->ghost) {
    do_say(mob,"Ghosts are not allowed in this place.");
    do_slay(mob,ch->name);
    return;
  }
  do_cb(mob,"Intruder! Intruder!");
  do_murder(mob,ch->name);
  return;
}

Assistant:

void greet_prog_knight(CHAR_DATA *mob, CHAR_DATA *ch)
{
	if (is_npc(ch))
		return;

	if (ch->ghost > 0)
	{
		do_say(mob, "Ghosts are not allowed in this place.");
		do_slay(mob, ch->name);
		return;
	}

	do_cb(mob, "Intruder! Intruder!");
	do_murder(mob, ch->name);
}